

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall duckdb::ColumnData::RevertAppend(ColumnData *this,row_t start_row)

{
  ColumnSegmentTree *this_00;
  ColumnSegment *pCVar1;
  unsigned_long uVar2;
  idx_t segment_start;
  SegmentLock l;
  unique_lock<std::mutex> uStack_38;
  
  this_00 = &this->data;
  ::std::unique_lock<std::mutex>::unique_lock
            (&uStack_38,&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock);
  pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetLastSegment
                     (&this_00->super_SegmentTree<duckdb::ColumnSegment,_false>,
                      (SegmentLock *)&uStack_38);
  uVar2 = NumericCastImpl<unsigned_long,_long,_false>::Convert(start_row);
  if (uVar2 < (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i +
              (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start) {
    segment_start =
         SegmentTree<duckdb::ColumnSegment,_false>::GetSegmentIndex
                   (&this_00->super_SegmentTree<duckdb::ColumnSegment,_false>,
                    (SegmentLock *)&uStack_38,start_row);
    pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegmentByIndex
                       (&this_00->super_SegmentTree<duckdb::ColumnSegment,_false>,
                        (SegmentLock *)&uStack_38,segment_start);
    SegmentTree<duckdb::ColumnSegment,_false>::EraseSegments
              (&this_00->super_SegmentTree<duckdb::ColumnSegment,_false>,(SegmentLock *)&uStack_38,
               segment_start);
    LOCK();
    (this->count).super___atomic_base<unsigned_long>._M_i = start_row - this->start;
    UNLOCK();
    LOCK();
    (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    ColumnSegment::RevertAppend(pCVar1,start_row);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return;
}

Assistant:

void ColumnData::RevertAppend(row_t start_row) {
	auto l = data.Lock();
	// check if this row is in the segment tree at all
	auto last_segment = data.GetLastSegment(l);
	if (NumericCast<idx_t>(start_row) >= last_segment->start + last_segment->count) {
		// the start row is equal to the final portion of the column data: nothing was ever appended here
		D_ASSERT(NumericCast<idx_t>(start_row) == last_segment->start + last_segment->count);
		return;
	}
	// find the segment index that the current row belongs to
	idx_t segment_index = data.GetSegmentIndex(l, UnsafeNumericCast<idx_t>(start_row));
	auto segment = data.GetSegmentByIndex(l, UnsafeNumericCast<int64_t>(segment_index));
	auto &transient = *segment;
	D_ASSERT(transient.segment_type == ColumnSegmentType::TRANSIENT);

	// remove any segments AFTER this segment: they should be deleted entirely
	data.EraseSegments(l, segment_index);

	this->count = UnsafeNumericCast<idx_t>(start_row) - this->start;
	segment->next = nullptr;
	transient.RevertAppend(UnsafeNumericCast<idx_t>(start_row));
}